

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardplural.cpp
# Opt level: O2

int32_t icu_63::StandardPlural::indexOrNegativeFromString(UnicodeString *keyword)

{
  short sVar1;
  int8_t iVar2;
  char cVar3;
  int iVar4;
  int32_t iVar5;
  ConstChar16Ptr local_a0;
  ConstChar16Ptr local_98;
  ConstChar16Ptr local_90;
  ConstChar16Ptr local_88;
  ConstChar16Ptr local_80;
  ConstChar16Ptr local_78 [3];
  char16_t *local_60;
  char16_t *local_50;
  char16_t *local_30;
  
  sVar1 = (keyword->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (keyword->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (iVar4 == 5) {
    local_a0.p_ = (char16_t *)gOther;
    iVar5 = 5;
    cVar3 = UnicodeString::compare(keyword,&local_a0,5);
  }
  else {
    if (iVar4 == 4) {
      local_90.p_ = L"manyzeroother睴o敦w慭祮漀桴牥";
      iVar2 = UnicodeString::compare(keyword,&local_90,4);
      local_30 = local_90.p_;
      if (iVar2 == '\0') {
        return 4;
      }
      local_98.p_ = L"zeroother睴o敦w慭祮漀桴牥";
      iVar2 = UnicodeString::compare(keyword,&local_98,4);
      if (iVar2 != '\0') {
        return -1;
      }
      return 0;
    }
    if (iVar4 != 3) {
      return -1;
    }
    local_78[0].p_ = L"onetwofewmanyzeroother睴o敦w慭祮漀桴牥";
    iVar2 = UnicodeString::compare(keyword,local_78,3);
    local_50 = local_78[0].p_;
    if (iVar2 == '\0') {
      return 1;
    }
    local_80.p_ = L"twofewmanyzeroother睴o敦w慭祮漀桴牥";
    iVar2 = UnicodeString::compare(keyword,&local_80,3);
    local_60 = local_80.p_;
    if (iVar2 == '\0') {
      return 2;
    }
    local_88.p_ = L"fewmanyzeroother睴o敦w慭祮漀桴牥";
    iVar5 = 3;
    cVar3 = UnicodeString::compare(keyword,&local_88,3);
  }
  if (cVar3 != '\0') {
    return -1;
  }
  return iVar5;
}

Assistant:

int32_t StandardPlural::indexOrNegativeFromString(const UnicodeString &keyword) {
    switch (keyword.length()) {
    case 3:
        if (keyword.compare(gOne, 3) == 0) {
            return ONE;
        } else if (keyword.compare(gTwo, 3) == 0) {
            return TWO;
        } else if (keyword.compare(gFew, 3) == 0) {
            return FEW;
        }
        break;
    case 4:
        if (keyword.compare(gMany, 4) == 0) {
            return MANY;
        } else if (keyword.compare(gZero, 4) == 0) {
            return ZERO;
        }
        break;
    case 5:
        if (keyword.compare(gOther, 5) == 0) {
            return OTHER;
        }
        break;
    default:
        break;
    }
    return -1;
}